

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
::find_non_soo<std::pair<void_const*,void_const*>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
           *this,key_arg<std::pair<const_void_*,_const_void_*>_> *key,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  ulong uVar13;
  ctrl_t *pcVar14;
  anon_union_8_1_a8a14541_for_iterator_2 unaff_R15;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  __m128i match;
  iterator iVar23;
  ulong local_60;
  char cVar18;
  char cVar20;
  char cVar21;
  char cVar22;
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar11 = (hash >> 7 ^ uVar3 >> 0xc) & uVar2;
  bVar9 = (byte)hash;
  pcVar14 = (ctrl_t *)(ulong)(bVar9 & 0x7f);
  auVar16 = ZEXT216(CONCAT11(bVar9,bVar9) & 0x7f7f);
  auVar16 = pshuflw(auVar16,auVar16,0);
  local_60 = 0;
  do {
    pcVar1 = (char *)(uVar3 + uVar11);
    cVar8 = pcVar1[0xf];
    cVar18 = auVar16[0];
    auVar19[0] = -(cVar18 == *pcVar1);
    cVar20 = auVar16[1];
    auVar19[1] = -(cVar20 == pcVar1[1]);
    cVar21 = auVar16[2];
    auVar19[2] = -(cVar21 == pcVar1[2]);
    cVar22 = auVar16[3];
    auVar19[3] = -(cVar22 == pcVar1[3]);
    auVar19[4] = -(cVar18 == pcVar1[4]);
    auVar19[5] = -(cVar20 == pcVar1[5]);
    auVar19[6] = -(cVar21 == pcVar1[6]);
    auVar19[7] = -(cVar22 == pcVar1[7]);
    auVar19[8] = -(cVar18 == pcVar1[8]);
    auVar19[9] = -(cVar20 == pcVar1[9]);
    auVar19[10] = -(cVar21 == pcVar1[10]);
    auVar19[0xb] = -(cVar22 == pcVar1[0xb]);
    auVar19[0xc] = -(cVar18 == pcVar1[0xc]);
    auVar19[0xd] = -(cVar20 == pcVar1[0xd]);
    auVar19[0xe] = -(cVar21 == pcVar1[0xe]);
    auVar19[0xf] = -(cVar22 == cVar8);
    uVar12 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    uVar10 = (uint)uVar12;
    bVar15 = uVar12 == 0;
    if (!bVar15) {
      lVar4 = *(long *)(this + 0x18);
      do {
        uVar5 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar13 = uVar5 + uVar11 & uVar2;
        bVar6 = *(void **)(lVar4 + 8 + uVar13 * 0x18) == key->second;
        bVar7 = *(void **)(lVar4 + uVar13 * 0x18) == key->first;
        if (bVar6 && bVar7) {
          if (*(long *)(this + 0x10) == 0) {
            __assert_fail("ctrl != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x9ef,
                          "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>]"
                         );
          }
          unaff_R15.slot_ = (slot_type *)(lVar4 + uVar13 * 0x18);
          pcVar14 = (ctrl_t *)(uVar13 + *(long *)(this + 0x10));
        }
        if (bVar6 && bVar7) break;
        uVar12 = (ushort)(uVar10 - 1) & (ushort)uVar10;
        uVar10 = CONCAT22((short)(uVar10 - 1 >> 0x10),uVar12);
        bVar15 = uVar12 == 0;
      } while (!bVar15);
    }
    if (bVar15) {
      auVar17[0] = -(*pcVar1 == -0x80);
      auVar17[1] = -(pcVar1[1] == -0x80);
      auVar17[2] = -(pcVar1[2] == -0x80);
      auVar17[3] = -(pcVar1[3] == -0x80);
      auVar17[4] = -(pcVar1[4] == -0x80);
      auVar17[5] = -(pcVar1[5] == -0x80);
      auVar17[6] = -(pcVar1[6] == -0x80);
      auVar17[7] = -(pcVar1[7] == -0x80);
      auVar17[8] = -(pcVar1[8] == -0x80);
      auVar17[9] = -(pcVar1[9] == -0x80);
      auVar17[10] = -(pcVar1[10] == -0x80);
      auVar17[0xb] = -(pcVar1[0xb] == -0x80);
      auVar17[0xc] = -(pcVar1[0xc] == -0x80);
      auVar17[0xd] = -(pcVar1[0xd] == -0x80);
      auVar17[0xe] = -(pcVar1[0xe] == -0x80);
      auVar17[0xf] = -(cVar8 == -0x80);
      if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar8 == -0x80) {
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                    *)this);
        pcVar14 = (ctrl_t *)0x0;
        goto LAB_0060d744;
      }
      if (*(ulong *)this < local_60 + 0x10) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>, K = std::pair<const void *, const void *>]"
                     );
      }
      uVar11 = uVar11 + local_60 + 0x10 & uVar2;
      bVar15 = true;
      local_60 = local_60 + 0x10;
    }
    else {
LAB_0060d744:
      bVar15 = false;
    }
    if (!bVar15) {
      iVar23.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_2)
           (anon_union_8_1_a8a14541_for_iterator_2)unaff_R15.slot_;
      iVar23.ctrl_ = pcVar14;
      return iVar23;
    }
  } while( true );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }